

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
nnad::FeedForwardNN<double>::Evaluate
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          FeedForwardNN<double> *this,vector<double,_std::allocator<double>_> *Input)

{
  function<double_(const_double_&)> *__x;
  int *piVar1;
  pointer piVar2;
  double *pdVar3;
  int iVar4;
  double *pdVar5;
  vector<double,_std::allocator<double>_> *this_00;
  FeedForwardNN<double> *pFVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  mapped_type *pmVar8;
  double *pdVar9;
  ostream *poVar10;
  double *pdVar11;
  vector<double,_std::allocator<double>_> prep;
  Matrix<double> y;
  vector<double,_std::allocator<double>_> *NN;
  key_type local_128;
  int local_124;
  Matrix<double> local_120;
  Matrix<double> local_100;
  vector<double,_std::allocator<double>_> *local_e0;
  FeedForwardNN<double> *local_d8;
  Matrix<double> local_d0;
  Matrix<double> local_b0;
  vector<double,_std::allocator<double>_> *local_90;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *local_88;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *local_80;
  int local_74;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  piVar1 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_120._Lines =
       (int)((ulong)((long)(Input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(Input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
  local_e0 = __return_storage_ptr__;
  if (*piVar1 == local_120._Lines) {
    piVar2 = (this->_Arch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_d0._Lines = 1;
    local_d8 = this;
    local_90 = Input;
    Matrix<double>::Matrix(&local_100,&local_120._Lines,&local_d0._Lines,Input);
    iVar4 = (int)((ulong)((long)piVar2 - (long)piVar1) >> 2);
    local_124 = iVar4 + -1;
    local_128 = 1;
    if (2 < iVar4) {
      local_80 = &local_d8->_Links;
      local_88 = &local_d8->_Biases;
      __x = &local_d8->_ActFun;
      do {
        pmVar8 = std::
                 map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                 ::at(local_80,&local_128);
        Matrix<double>::operator*(&local_b0,pmVar8,&local_100);
        pmVar8 = std::
                 map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                 ::at(local_88,&local_128);
        Matrix<double>::operator+(&local_d0,&local_b0,pmVar8);
        std::function<double_(const_double_&)>::function
                  ((function<double_(const_double_&)> *)&local_50,__x);
        Matrix<double>::Matrix(&local_120,&local_d0,(function<double_(const_double_&)> *)&local_50);
        Matrix<double>::operator=(&local_100,&local_120);
        if (local_120._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_120._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_120._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_120._Matrix.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        if (local_d0._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0._Matrix.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0._Matrix.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b0._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b0._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_b0._Matrix.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b0._Matrix.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_128 = local_128 + 1;
      } while (local_128 < local_124);
    }
    pFVar6 = local_d8;
    local_128 = local_124;
    pmVar8 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::at(&local_d8->_Links,&local_128);
    Matrix<double>::operator*(&local_b0,pmVar8,&local_100);
    local_74 = local_124;
    pmVar8 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::at(&pFVar6->_Biases,&local_74);
    pvVar7 = local_90;
    this_00 = local_e0;
    Matrix<double>::operator+(&local_d0,&local_b0,pmVar8);
    std::function<double_(const_double_&)>::function
              ((function<double_(const_double_&)> *)&local_70,&pFVar6->_OutputActFun);
    Matrix<double>::Matrix(&local_120,&local_d0,(function<double_(const_double_&)> *)&local_70);
    std::vector<double,_std::allocator<double>_>::vector(this_00,&local_120._Matrix);
    if (local_120._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_120._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
    if (local_d0._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d0._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pFVar6->_Preproc).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(pFVar6->_Preproc)._M_invoker)
                ((vector<double,_std::allocator<double>_> *)&local_120,
                 (_Any_data *)&pFVar6->_Preproc,pvVar7,&pFVar6->_PreprocPars);
      pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar5 = (double *)CONCAT44(local_120._Columns,local_120._Lines);
      pdVar11 = pdVar5;
      for (pdVar9 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start; pdVar9 != pdVar3; pdVar9 = pdVar9 + 1) {
        *pdVar9 = *pdVar9 * *pdVar11;
        pdVar11 = pdVar11 + 1;
      }
      if (pdVar5 != (double *)0x0) {
        operator_delete(pdVar5,(long)local_120._Matrix.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar5);
      }
    }
    if (local_100._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_100._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_100._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return this_00;
  }
  local_100._0_8_ =
       &local_100._Matrix.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,
             "Evaluate: the number of inputs does not match the number of input nodes.","");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1;31mERROR: ",0xe);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_100._0_8_,
                       (long)local_100._Matrix.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[0m",4);
  std::endl<char,std::char_traits<char>>(poVar10);
  exit(-10);
}

Assistant:

std::vector<T> Evaluate(std::vector<T> const& Input) const
    {
      // Check that the size of the input vector is equal to the number of
      // input nodes.
      if ((int) Input.size() != _Arch[0])
        Error("Evaluate: the number of inputs does not match the number of input nodes.");

      // Number of layers
      const int nl = (int) _Arch.size();

      // Construct output of the NN recursively for the hidden layers
      Matrix<T> y{(int) Input.size(), 1, Input};
      for (int l = 1; l < nl - 1; l++)
        y = Matrix<T> {_Links.at(l) * y + _Biases.at(l), _ActFun};

      // Compute NN
      std::vector<T> NN = (Matrix<T> {_Links.at(nl - 1) * y + _Biases.at(nl - 1), _OutputActFun}).GetVector();

      // Include preprocessing function if necessary
      if (_Preproc != nullptr)
        {
          const std::vector<T> prep = _Preproc(Input, _PreprocPars);
          std::transform(NN.begin(), NN.end(), prep.begin(), NN.begin(), std::multiplies<T>());
        }

      return NN;
    }